

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::JsonLocation::Invalid
          (JsonLocation *this,unsigned_long *param_2,size_t param_3,size_t param_4)

{
  string *out;
  undefined1 auVar1 [16];
  string_view to_obfuscate_00;
  string local_d8;
  AlphaNum local_b8;
  undefined1 local_88 [8];
  string to_obfuscate;
  allocator<char> local_51;
  string local_50 [8];
  string status_message;
  JsonLocation *this_local;
  undefined1 local_20 [8];
  string_view message_local;
  
  status_message.field_2._8_8_ = param_2;
  local_20 = (undefined1  [8])param_3;
  message_local._M_len = param_4;
  message_local._M_str = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"invalid JSON",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::string((string *)local_88);
  if (param_2[3] != 0) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_b8," in ");
    absl::lts_20240722::StrAppend((string *)local_88,&local_b8);
    MessagePath::Describe((MessagePath *)param_2[3],(string *)local_88);
    std::__cxx11::string::push_back((char)local_88);
  }
  absl::lts_20240722::str_format_internal::
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)524292>
  ::FormatSpecTemplate
            ((FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)524292>
              *)&local_d8.field_2," near %zu:%zu (offset %zu): %s");
  local_d8._M_string_length = param_2[1] + 1;
  local_d8._0_8_ = param_2[2] + 1;
  out = &local_d8;
  absl::lts_20240722::
  StrAppendFormat<unsigned_long,_unsigned_long,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((Nonnull<std::string_*>)local_88,
             (FormatSpec<unsigned_long,_unsigned_long,_unsigned_long,_std::basic_string_view<char>_>
              *)&local_d8.field_2,&local_d8._M_string_length,(unsigned_long *)out,param_2,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
  to_obfuscate_00._M_str = (char *)local_50;
  to_obfuscate_00._M_len = auVar1._8_8_;
  anon_unknown_1::HardenAgainstHyrumsLaw(auVar1._0_8_,to_obfuscate_00,out);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
  absl::lts_20240722::InvalidArgumentError(this,auVar1._0_8_,auVar1._8_8_);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_50);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLocation::Invalid(absl::string_view message,
                                   SourceLocation sl) const {
  // NOTE: we intentionally do not harden the "invalid JSON" part, so that
  // people have a hope of grepping for it in logs. That part is easy to
  // commit to, as stability goes.
  //
  // This copies the error twice. Because this is the "unhappy" path, this
  // function is cold and can afford the waste.
  std::string status_message = "invalid JSON";
  std::string to_obfuscate;
  if (path != nullptr) {
    absl::StrAppend(&to_obfuscate, " in ");
    path->Describe(to_obfuscate);
    to_obfuscate.push_back(',');
  }
  absl::StrAppendFormat(&to_obfuscate, " near %zu:%zu (offset %zu): %s",
                        line + 1, col + 1, offset, message);
  HardenAgainstHyrumsLaw(to_obfuscate, status_message);

  return absl::InvalidArgumentError(std::move(status_message));
}